

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

optional<unsigned_int> __thiscall slang::strToUInt(slang *this,string_view str,size_t *pos,int base)

{
  undefined8 in_RAX;
  ulong uVar1;
  ulong uVar2;
  char *__first;
  __integer_from_chars_result_type<unsigned_int> _Var3;
  uint32_t value;
  uint local_14;
  
  local_14 = (uint)((ulong)in_RAX >> 0x20);
  __first = (char *)str._M_len;
  _Var3 = std::from_chars<unsigned_int>(__first,__first + (long)this,&local_14,(int)pos);
  if (_Var3.ec == 0) {
    if ((long *)str._M_str != (long *)0x0) {
      *(long *)str._M_str = (long)_Var3.ptr - (long)__first;
    }
    uVar1 = (ulong)local_14;
    uVar2 = 0x100000000;
  }
  else {
    uVar1 = 0;
    uVar2 = 0;
  }
  return (optional<unsigned_int>)(uVar1 | uVar2);
}

Assistant:

std::optional<uint32_t> strToUInt(std::string_view str, size_t* pos, int base) {
    uint32_t value;
    auto result = std::from_chars(str.data(), str.data() + str.size(), value, base);
    if (result.ec != std::errc())
        return std::nullopt;

    if (pos)
        *pos = size_t(result.ptr - str.data());
    return value;
}